

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O0

Belief * __thiscall despot::Pocman::InitialBelief(Pocman *this,State *start,string *type)

{
  size_type __n;
  value_type pSVar1;
  reference ppSVar2;
  PocmanBelief *this_00;
  double dVar3;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_98;
  allocator<char> local_79;
  string local_78 [32];
  int local_58;
  int i;
  allocator<despot::State_*> local_41;
  undefined1 local_40 [8];
  vector<despot::State_*,_std::allocator<despot::State_*>_> particles;
  int N;
  string *type_local;
  State *start_local;
  Pocman *this_local;
  
  particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = PocmanBelief::num_particles;
  __n = (size_type)PocmanBelief::num_particles;
  std::allocator<despot::State_*>::allocator(&local_41);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_40,__n,&local_41);
  std::allocator<despot::State_*>::~allocator(&local_41);
  for (local_58 = 0;
      local_58 <
      particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_; local_58 = local_58 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_78,"DEFAULT",&local_79);
    pSVar1 = (value_type)(**(code **)(*(long *)this + 0x40))(this,local_78);
    ppSVar2 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_40,
                         (long)local_58);
    *ppSVar2 = pSVar1;
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator(&local_79);
    dVar3 = (double)particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    ppSVar2 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_40,
                         (long)local_58);
    *(double *)(*ppSVar2 + 0x18) = 1.0 / dVar3;
  }
  this_00 = (PocmanBelief *)operator_new(0x98);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            (&local_98,(vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_40);
  PocmanBelief::PocmanBelief(this_00,&local_98,&this->super_DSPOMDP,(Belief *)0x0);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector(&local_98);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_40);
  return (Belief *)this_00;
}

Assistant:

Belief* Pocman::InitialBelief(const State* start, string type) const {
	int N = PocmanBelief::num_particles;
	vector<State*> particles(N);
	for (int i = 0; i < N; i++) {
		particles[i] = CreateStartState();
		particles[i]->weight = 1.0 / N;
	}

	return new PocmanBelief(particles, this);
}